

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.cc
# Opt level: O0

void init_default_stack_impl_inner(void)

{
  GetStackImplementation *pGVar1;
  int iVar2;
  char *__s2;
  GetStackImplementation *c;
  int i;
  char *val;
  
  if (!get_stack_impl_inited) {
    get_stack_impl = all_impls[0];
    get_stack_impl_inited = true;
    __s2 = TCMallocGetenvSafe("TCMALLOC_STACKTRACE_METHOD");
    if ((__s2 == (char *)0x0) || (*__s2 == '\0')) {
      maybe_convert_libunwind_to_generic_fp();
    }
    else {
      for (c._4_4_ = 0; c._4_4_ < 4; c._4_4_ = c._4_4_ + 1) {
        pGVar1 = all_impls[(int)c._4_4_];
        iVar2 = strcmp(pGVar1->name,__s2);
        if (iVar2 == 0) {
          get_stack_impl = pGVar1;
          return;
        }
      }
      fprintf(_stderr,"Unknown or unsupported stacktrace method requested: %s. Ignoring it\n",__s2);
    }
  }
  return;
}

Assistant:

static void init_default_stack_impl_inner(void) {
  if (get_stack_impl_inited) {
    return;
  }
  get_stack_impl = all_impls[0];
  get_stack_impl_inited = true;
  const char *val = TCMallocGetenvSafe("TCMALLOC_STACKTRACE_METHOD");
  if (!val || !*val) {
    // If no explicit implementation is requested, consider changing
    // libunwind->generic_fp in some cases.
    maybe_convert_libunwind_to_generic_fp();
    return;
  }
  for (int i = 0; i < sizeof(all_impls) / sizeof(all_impls[0]); i++) {
    GetStackImplementation *c = all_impls[i];
    if (strcmp(c->name, val) == 0) {
      get_stack_impl = c;
      return;
    }
  }
  fprintf(stderr, "Unknown or unsupported stacktrace method requested: %s. Ignoring it\n", val);
}